

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::SetScissorRects
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,Uint32 NumRects,Rect *pRects,
          Uint32 *RTWidth,Uint32 *RTHeight)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  Int32 IVar3;
  Int32 IVar4;
  Int32 IVar5;
  Uint32 UVar6;
  Rect *extraout_RDX;
  Rect *extraout_RDX_00;
  Rect *pRVar7;
  ulong uVar8;
  DeviceContextBase<Diligent::EngineGLImplTraits> *pDVar9;
  char (*in_R9) [8];
  string msg;
  char (*in_stack_ffffffffffffff78) [2];
  string local_80;
  Uint32 local_5c;
  DeviceContextBase<Diligent::EngineGLImplTraits> *local_58;
  String local_50;
  
  pRVar7 = pRects;
  local_5c = NumRects;
  local_58 = this;
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&local_80,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (local_80._M_dataplus._M_p,"SetScissorRects",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x3c5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    FormatString<char[97]>
              (&local_80,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"SetScissorRects",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x3c5);
    pRVar7 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      pRVar7 = extraout_RDX_00;
    }
  }
  CVar2 = (local_58->m_Desc).QueueType;
  if ((~CVar2 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_
              (&local_50,(Diligent *)(ulong)CVar2,(COMMAND_QUEUE_TYPE)pRVar7);
    FormatString<char[16],char[22],std::__cxx11::string,char[8]>
              (&local_80,(Diligent *)"SetScissorRects",(char (*) [16])0x917e3a,
               (char (*) [22])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"SetScissorRects",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x3c5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((1 < local_5c) &&
     ((((local_58->m_pDevice).m_pObject)->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).
      m_DeviceInfo.Features.MultiViewport == DEVICE_FEATURE_STATE_DISABLED)) {
    FormatString<char[80]>
              (&local_80,
               (char (*) [80])
               "IDeviceContext::SetScissorRects: multi viewport is not supported by this device");
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"SetScissorRects",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x3ca);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((*RTWidth == 0) || (*RTHeight == 0)) {
    *RTWidth = local_58->m_FramebufferWidth;
    *RTHeight = local_58->m_FramebufferHeight;
  }
  if (0xf < local_5c) {
    FormatString<char[26],unsigned_int,char[22],unsigned_int,char[2]>
              (&local_80,(Diligent *)"Number of scissor rects (",(char (*) [26])&local_5c,
               (uint *)") exceeds the limit (",(char (*) [22])&MAX_VIEWPORTS,(uint *)0x930f15,
               in_stack_ffffffffffffff78);
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"SetScissorRects",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x3d2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  UVar6 = 0x10;
  if (local_5c < 0x10) {
    UVar6 = local_5c;
  }
  local_58->m_NumScissorRects = UVar6;
  pDVar9 = local_58;
  if (local_5c != 0) {
    pRVar7 = local_58->m_ScissorRects;
    uVar8 = 0;
    do {
      IVar3 = pRects->top;
      IVar4 = pRects->right;
      IVar5 = pRects->bottom;
      pRVar7->left = pRects->left;
      pRVar7->top = IVar3;
      pRVar7->right = IVar4;
      pRVar7->bottom = IVar5;
      if (pRVar7->right < pRVar7->left) {
        FormatString<char[49],int,char[3],int,char[2]>
                  (&local_80,(Diligent *)"Incorrect horizontal bounds for a scissor rect [",
                   (char (*) [49])pRVar7,(int *)0x92ff04,(char (*) [3])&pRVar7->right,
                   (int *)0x930f15,in_stack_ffffffffffffff78);
        DebugAssertionFailed
                  (local_80._M_dataplus._M_p,"SetScissorRects",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x3d8);
        pDVar9 = local_58;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          pDVar9 = local_58;
        }
      }
      if (pRVar7->bottom < pRVar7->top) {
        FormatString<char[47],int,char[3],int,char[2]>
                  (&local_80,(Diligent *)"Incorrect vertical bounds for a scissor rect [",
                   (char (*) [47])&pRVar7->top,(int *)0x92ff04,(char (*) [3])&pRVar7->bottom,
                   (int *)0x930f15,in_stack_ffffffffffffff78);
        DebugAssertionFailed
                  (local_80._M_dataplus._M_p,"SetScissorRects",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x3d9);
        pDVar9 = local_58;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          pDVar9 = local_58;
        }
      }
      uVar8 = uVar8 + 1;
      pRects = pRects + 1;
      pRVar7 = pRVar7 + 1;
    } while (uVar8 < pDVar9->m_NumScissorRects);
  }
  pUVar1 = &(pDVar9->m_Stats).CommandCounters.SetScissorRects;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::SetScissorRects(
    Uint32      NumRects,
    const Rect* pRects,
    Uint32&     RTWidth,
    Uint32&     RTHeight)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "SetScissorRects");

    if (NumRects > 1)
    {
        DEV_CHECK_ERR(m_pDevice->GetFeatures().MultiViewport,
                      "IDeviceContext::SetScissorRects: multi viewport is not supported by this device");
    }
    if (RTWidth == 0 || RTHeight == 0)
    {
        RTWidth  = m_FramebufferWidth;
        RTHeight = m_FramebufferHeight;
    }

    DEV_CHECK_ERR(NumRects < MAX_VIEWPORTS, "Number of scissor rects (", NumRects, ") exceeds the limit (", MAX_VIEWPORTS, ")");
    m_NumScissorRects = (std::min)(MAX_VIEWPORTS, NumRects);

    for (Uint32 sr = 0; sr < m_NumScissorRects; ++sr)
    {
        m_ScissorRects[sr] = pRects[sr];
        DEV_CHECK_ERR(m_ScissorRects[sr].left <= m_ScissorRects[sr].right, "Incorrect horizontal bounds for a scissor rect [", m_ScissorRects[sr].left, ", ", m_ScissorRects[sr].right, ")");
        DEV_CHECK_ERR(m_ScissorRects[sr].top <= m_ScissorRects[sr].bottom, "Incorrect vertical bounds for a scissor rect [", m_ScissorRects[sr].top, ", ", m_ScissorRects[sr].bottom, ")");
    }

    ++m_Stats.CommandCounters.SetScissorRects;
}